

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O1

string * __thiscall
phosg::format_size_abi_cxx11_
          (string *__return_storage_ptr__,phosg *this,size_t size,bool include_bytes)

{
  undefined7 in_register_00000009;
  ulong uVar1;
  char *pcVar2;
  double dVar3;
  
  uVar1 = CONCAT71(in_register_00000009,include_bytes);
  if (this < (phosg *)0x400) {
    string_printf_abi_cxx11_(__return_storage_ptr__,"%zu bytes",this,uVar1);
  }
  else if ((char)size == '\0') {
    if (this < (phosg *)0x100000) {
      dVar3 = (double)((float)(long)this * 0.0009765625);
      pcVar2 = "%.02f KB";
    }
    else if (this < (phosg *)0x40000000) {
      dVar3 = (double)((float)(long)this * 9.536743e-07);
      pcVar2 = "%.02f MB";
    }
    else if ((ulong)this >> 0x28 == 0) {
      dVar3 = (double)((float)(long)this * 9.313226e-10);
      pcVar2 = "%.02f GB";
      uVar1 = 0;
    }
    else if ((ulong)this >> 0x32 == 0) {
      dVar3 = (double)((float)(long)this * 9.094947e-13);
      pcVar2 = "%.02f TB";
      uVar1 = 0;
    }
    else {
      uVar1 = (ulong)this >> 0x3c;
      if ((long)this < 0) {
        size = (ulong)this >> 1;
      }
      if (uVar1 == 0) {
        dVar3 = (double)((float)this * 8.881784e-16);
        pcVar2 = "%.02f PB";
      }
      else {
        dVar3 = (double)((float)this * 8.6736174e-19);
        pcVar2 = "%.02f EB";
      }
    }
    string_printf_abi_cxx11_(__return_storage_ptr__,pcVar2,dVar3,size,uVar1);
  }
  else {
    if (this < (phosg *)0x100000) {
      dVar3 = (double)((float)(long)this * 0.0009765625);
      pcVar2 = "%zu bytes (%.02f KB)";
    }
    else if (this < (phosg *)0x40000000) {
      dVar3 = (double)((float)(long)this * 9.536743e-07);
      pcVar2 = "%zu bytes (%.02f MB)";
    }
    else if ((ulong)this >> 0x28 == 0) {
      dVar3 = (double)((float)(long)this * 9.313226e-10);
      pcVar2 = "%zu bytes (%.02f GB)";
      uVar1 = 0;
    }
    else if ((ulong)this >> 0x32 == 0) {
      dVar3 = (double)((float)(long)this * 9.094947e-13);
      pcVar2 = "%zu bytes (%.02f TB)";
      uVar1 = 0;
    }
    else {
      uVar1 = (ulong)this >> 0x3c;
      if (uVar1 == 0) {
        dVar3 = (double)((float)this * 8.881784e-16);
        pcVar2 = "%zu bytes (%.02f PB)";
      }
      else {
        dVar3 = (double)((float)this * 8.6736174e-19);
        pcVar2 = "%zu bytes (%.02f EB)";
      }
    }
    string_printf_abi_cxx11_(__return_storage_ptr__,pcVar2,dVar3,this,uVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

string format_size(size_t size, bool include_bytes) {
  if (size < KB_SIZE) {
    return string_printf("%zu bytes", size);
  }
  if (include_bytes) {
    if (size < MB_SIZE) {
      return string_printf("%zu bytes (%.02f KB)", size, (float)size / KB_SIZE);
    }
    if (size < GB_SIZE) {
      return string_printf("%zu bytes (%.02f MB)", size, (float)size / MB_SIZE);
    }
    if (size < TB_SIZE) {
      return string_printf("%zu bytes (%.02f GB)", size, (float)size / GB_SIZE);
    }
    if (size < PB_SIZE) {
      return string_printf("%zu bytes (%.02f TB)", size, (float)size / TB_SIZE);
    }
    if (size < EB_SIZE) {
      return string_printf("%zu bytes (%.02f PB)", size, (float)size / PB_SIZE);
    }
    return string_printf("%zu bytes (%.02f EB)", size, (float)size / EB_SIZE);
  } else {
    if (size < MB_SIZE) {
      return string_printf("%.02f KB", (float)size / KB_SIZE);
    }
    if (size < GB_SIZE) {
      return string_printf("%.02f MB", (float)size / MB_SIZE);
    }
    if (size < TB_SIZE) {
      return string_printf("%.02f GB", (float)size / GB_SIZE);
    }
    if (size < PB_SIZE) {
      return string_printf("%.02f TB", (float)size / TB_SIZE);
    }
    if (size < EB_SIZE) {
      return string_printf("%.02f PB", (float)size / PB_SIZE);
    }
    return string_printf("%.02f EB", (float)size / EB_SIZE);
  }
}